

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O0

int nn_rep_events(nn_sockbase *self)

{
  nn_sockbase *in_RDI;
  int events;
  nn_rep *rep;
  uint local_14;
  
  if (in_RDI == (nn_sockbase *)0x0) {
    in_RDI = (nn_sockbase *)0x0;
  }
  local_14 = nn_xrep_events(in_RDI);
  if (((ulong)in_RDI[0x1b].vfptr & 1) == 0) {
    local_14 = local_14 & 0xfffffffd;
  }
  return local_14;
}

Assistant:

int nn_rep_events (struct nn_sockbase *self)
{
    struct nn_rep *rep;
    int events;

    rep = nn_cont (self, struct nn_rep, xrep.sockbase);
    events = nn_xrep_events (&rep->xrep.sockbase);
    if (!(rep->flags & NN_REP_INPROGRESS))
        events &= ~NN_SOCKBASE_EVENT_OUT;
    return events;
}